

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateForwardDeclarations
          (FileGenerator *this,Printer *printer)

{
  cpp *pcVar1;
  Options *pOVar2;
  _Hash_node_base *p_Var3;
  Options *pOVar4;
  _Rb_tree_node_base *p_Var5;
  mapped_type *pmVar6;
  _Base_ptr p_Var7;
  ulong uVar8;
  Descriptor **ppDVar9;
  EnumDescriptor **ppEVar10;
  Descriptor **ppDVar11;
  iterator iVar12;
  Options *options;
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  classes;
  vector<const_google::protobuf::EnumDescriptor_*,_std::allocator<const_google::protobuf::EnumDescriptor_*>_>
  enums;
  NamespaceOpener ns;
  unordered_set<const_google::protobuf::FileDescriptor_*,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  public_set;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>_>
  decls;
  Formatter format;
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  local_138;
  EnumDescriptor **local_118;
  iterator iStack_110;
  EnumDescriptor **local_108;
  string local_f8;
  _Hashtable<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>,_std::__detail::_Identity,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_d8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>_>
  local_98;
  Formatter local_68;
  
  local_68.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_68.vars_._M_t,&(this->variables_)._M_t);
  local_138.
  super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (Descriptor **)0x0;
  local_138.
  super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (Descriptor **)0x0;
  local_138.
  super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (Descriptor **)0x0;
  local_108 = (EnumDescriptor **)0x0;
  local_118 = (EnumDescriptor **)0x0;
  iStack_110._M_current = (EnumDescriptor **)0x0;
  FlattenMessagesInFile(this->file_,&local_138);
  if ((this->options_).proto_h == true) {
    local_d8._M_buckets = (__buckets_ptr)0x0;
    local_d8._M_bucket_count = 0;
    local_d8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    ListAllFields(this->file_,
                  (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   *)&local_d8);
    if ((__buckets_ptr)local_d8._M_bucket_count != local_d8._M_buckets) {
      uVar8 = 0;
      do {
        local_98._M_impl._0_8_ = local_d8._M_buckets[uVar8][10]._M_nxt;
        if (local_138.
            super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_138.
            super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
          ::_M_realloc_insert<google::protobuf::Descriptor_const*>
                    ((vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
                      *)&local_138,
                     (iterator)
                     local_138.
                     super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(Descriptor **)&local_98);
        }
        else {
          *local_138.
           super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
           ._M_impl.super__Vector_impl_data._M_finish = (Descriptor *)local_98._M_impl._0_8_;
          local_138.
          super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_138.
               super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        local_98._M_impl._0_8_ =
             FieldDescriptor::message_type((FieldDescriptor *)local_d8._M_buckets[uVar8]);
        if (local_138.
            super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_138.
            super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
          ::_M_realloc_insert<google::protobuf::Descriptor_const*>
                    ((vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
                      *)&local_138,
                     (iterator)
                     local_138.
                     super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(Descriptor **)&local_98);
        }
        else {
          *local_138.
           super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
           ._M_impl.super__Vector_impl_data._M_finish = (Descriptor *)local_98._M_impl._0_8_;
          local_138.
          super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_138.
               super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        local_98._M_impl._0_8_ =
             FieldDescriptor::enum_type((FieldDescriptor *)local_d8._M_buckets[uVar8]);
        if (iStack_110._M_current == local_108) {
          std::
          vector<google::protobuf::EnumDescriptor_const*,std::allocator<google::protobuf::EnumDescriptor_const*>>
          ::_M_realloc_insert<google::protobuf::EnumDescriptor_const*>
                    ((vector<google::protobuf::EnumDescriptor_const*,std::allocator<google::protobuf::EnumDescriptor_const*>>
                      *)&local_118,iStack_110,(EnumDescriptor **)&local_98);
        }
        else {
          *iStack_110._M_current = (EnumDescriptor *)local_98._M_impl._0_8_;
          iStack_110._M_current = iStack_110._M_current + 1;
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < (ulong)((long)(local_d8._M_bucket_count - (long)local_d8._M_buckets) >> 3));
    }
    ListAllTypesForServices(this->file_,&local_138);
    if (local_d8._M_buckets != (__buckets_ptr)0x0) {
      operator_delete(local_d8._M_buckets);
    }
  }
  local_d8._M_buckets = &local_d8._M_single_bucket;
  local_d8._M_bucket_count = 1;
  local_d8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_d8._M_element_count = 0;
  local_d8._M_rehash_policy._M_max_load_factor = 1.0;
  local_d8._M_rehash_policy._M_next_resize = 0;
  local_d8._M_single_bucket = (__node_base_ptr)0x0;
  PublicImportDFS(this->file_,
                  (unordered_set<const_google::protobuf::FileDescriptor_*,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                   *)&local_d8);
  options = &this->options_;
  p_Var5 = (_Rb_tree_node_base *)((long)&local_98 + 8);
  local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98._M_impl.super__Rb_tree_header._M_header._M_left = p_Var5;
  local_98._M_impl.super__Rb_tree_header._M_header._M_right = p_Var5;
  if (local_138.
      super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_138.
      super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar8 = 0;
    ppDVar9 = local_138.
              super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppDVar11 = local_138.
               super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    do {
      pcVar1 = (cpp *)ppDVar9[uVar8];
      if (pcVar1 != (cpp *)0x0) {
        pOVar2 = *(Options **)(pcVar1 + 0x10);
        if (local_d8._M_buckets[(ulong)pOVar2 % local_d8._M_bucket_count] != (__node_base_ptr)0x0) {
          p_Var3 = local_d8._M_buckets[(ulong)pOVar2 % local_d8._M_bucket_count]->_M_nxt;
          pOVar4 = (Options *)p_Var3[1]._M_nxt;
          do {
            if (pOVar2 == pOVar4) goto LAB_00283b3c;
            p_Var3 = p_Var3->_M_nxt;
          } while ((p_Var3 != (_Hash_node_base *)0x0) &&
                  (pOVar4 = (Options *)p_Var3[1]._M_nxt,
                  (ulong)pOVar4 % local_d8._M_bucket_count ==
                  (ulong)pOVar2 % local_d8._M_bucket_count));
        }
        Namespace_abi_cxx11_(&local_f8,pcVar1,(Descriptor *)options,pOVar2);
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>_>
                               *)&local_98,&local_f8);
        ForwardDeclarations::AddMessage(pmVar6,(Descriptor *)pcVar1);
        ppDVar9 = local_138.
                  super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppDVar11 = local_138.
                   super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p);
          ppDVar9 = local_138.
                    super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppDVar11 = local_138.
                     super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
        }
      }
LAB_00283b3c:
      uVar8 = uVar8 + 1;
    } while (uVar8 < (ulong)((long)ppDVar11 - (long)ppDVar9 >> 3));
  }
  if (iStack_110._M_current != local_118) {
    uVar8 = 0;
    ppEVar10 = local_118;
    iVar12._M_current = iStack_110._M_current;
    do {
      pcVar1 = (cpp *)ppEVar10[uVar8];
      if (pcVar1 != (cpp *)0x0) {
        pOVar2 = *(Options **)(pcVar1 + 0x10);
        if (local_d8._M_buckets[(ulong)pOVar2 % local_d8._M_bucket_count] != (__node_base_ptr)0x0) {
          p_Var3 = local_d8._M_buckets[(ulong)pOVar2 % local_d8._M_bucket_count]->_M_nxt;
          pOVar4 = (Options *)p_Var3[1]._M_nxt;
          do {
            if (pOVar2 == pOVar4) goto LAB_00283c0e;
            p_Var3 = p_Var3->_M_nxt;
          } while ((p_Var3 != (_Hash_node_base *)0x0) &&
                  (pOVar4 = (Options *)p_Var3[1]._M_nxt,
                  (ulong)pOVar4 % local_d8._M_bucket_count ==
                  (ulong)pOVar2 % local_d8._M_bucket_count));
        }
        Namespace_abi_cxx11_(&local_f8,pcVar1,(EnumDescriptor *)options,pOVar2);
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>_>
                               *)&local_98,&local_f8);
        ForwardDeclarations::AddEnum(pmVar6,(EnumDescriptor *)pcVar1);
        ppEVar10 = local_118;
        iVar12._M_current = iStack_110._M_current;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p);
          ppEVar10 = local_118;
          iVar12._M_current = iStack_110._M_current;
        }
      }
LAB_00283c0e:
      uVar8 = uVar8 + 1;
    } while (uVar8 < (ulong)((long)iVar12._M_current - (long)ppEVar10 >> 3));
  }
  local_f8._M_dataplus._M_p = &(local_68.printer_)->variable_delimiter_;
  local_f8._M_string_length = 0;
  local_f8.field_2._M_allocated_capacity = 0;
  local_f8.field_2._8_8_ = 0;
  if (local_98._M_impl.super__Rb_tree_header._M_header._M_left != p_Var5) {
    p_Var7 = local_98._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      NamespaceOpener::ChangeTo((NamespaceOpener *)&local_f8,(string *)(p_Var7 + 1));
      ForwardDeclarations::Print((ForwardDeclarations *)(p_Var7 + 2),&local_68,options);
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while (p_Var7 != p_Var5);
  }
  NamespaceOpener::~NamespaceOpener((NamespaceOpener *)&local_f8);
  Formatter::operator()<>(&local_68,"PROTOBUF_NAMESPACE_OPEN\n");
  if (local_98._M_impl.super__Rb_tree_header._M_header._M_left != p_Var5) {
    p_Var7 = local_98._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      ForwardDeclarations::PrintTopLevelDecl((ForwardDeclarations *)(p_Var7 + 2),&local_68,options);
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while (p_Var7 != p_Var5);
  }
  Formatter::operator()<>(&local_68,"PROTOBUF_NAMESPACE_CLOSE\n");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>_>
  ::~_Rb_tree(&local_98);
  std::
  _Hashtable<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>,_std::__detail::_Identity,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_d8);
  if (local_118 != (EnumDescriptor **)0x0) {
    operator_delete(local_118);
  }
  if (local_138.
      super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (Descriptor **)0x0) {
    operator_delete(local_138.
                    super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_68.vars_._M_t);
  return;
}

Assistant:

void FileGenerator::GenerateForwardDeclarations(io::Printer* printer) {
  Formatter format(printer, variables_);
  std::vector<const Descriptor*> classes;
  std::vector<const EnumDescriptor*> enums;

  FlattenMessagesInFile(file_, &classes);  // All messages need forward decls.

  if (options_.proto_h) {  // proto.h needs extra forward declarations.
    // All classes / enums refered to as field members
    std::vector<const FieldDescriptor*> fields;
    ListAllFields(file_, &fields);
    for (int i = 0; i < fields.size(); i++) {
      classes.push_back(fields[i]->containing_type());
      classes.push_back(fields[i]->message_type());
      enums.push_back(fields[i]->enum_type());
    }
    ListAllTypesForServices(file_, &classes);
  }

  // Calculate the set of files whose definitions we get through include.
  // No need to forward declare types that are defined in these.
  std::unordered_set<const FileDescriptor*> public_set;
  PublicImportDFS(file_, &public_set);

  std::map<std::string, ForwardDeclarations> decls;
  for (int i = 0; i < classes.size(); i++) {
    const Descriptor* d = classes[i];
    if (d && !public_set.count(d->file()))
      decls[Namespace(d, options_)].AddMessage(d);
  }
  for (int i = 0; i < enums.size(); i++) {
    const EnumDescriptor* d = enums[i];
    if (d && !public_set.count(d->file()))
      decls[Namespace(d, options_)].AddEnum(d);
  }


  {
    NamespaceOpener ns(format);
    for (const auto& pair : decls) {
      ns.ChangeTo(pair.first);
      pair.second.Print(format, options_);
    }
  }
  format("PROTOBUF_NAMESPACE_OPEN\n");
  for (const auto& pair : decls) {
    pair.second.PrintTopLevelDecl(format, options_);
  }
  format("PROTOBUF_NAMESPACE_CLOSE\n");
}